

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O0

void emit_peobj(BuildCtx *ctx)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long in_RDI;
  PEreloc reloc_2;
  uint16_t xdata [16];
  PEreloc reloc_1;
  uint32_t pdata [3];
  uint32_t fcofs;
  PEreloc reloc;
  anon_union_4_2_94730034 host_endian;
  int nrsym;
  int i;
  uint32_t sofs;
  PEsection pesect [4];
  PEheader pehdr;
  size_t in_stack_fffffffffffffec0;
  size_t sz;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  undefined2 uVar5;
  undefined2 in_stack_fffffffffffffed6;
  int scl;
  int type;
  int sect;
  uint32_t value;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  int local_d0;
  undefined4 local_c8;
  undefined1 local_c4;
  int local_b8;
  undefined4 local_b4;
  int local_b0;
  undefined2 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined2 local_9c;
  undefined4 local_90;
  int local_8c;
  int local_88;
  undefined2 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined2 local_74;
  undefined4 local_68;
  int local_64;
  int local_60;
  undefined2 local_58;
  undefined4 local_54;
  char local_50 [16];
  int local_40;
  int local_3c;
  undefined4 local_2c;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined4 local_18;
  int local_14;
  int local_10;
  undefined2 local_c;
  undefined2 local_a;
  long local_8;
  
  local_8 = in_RDI;
  memset(&local_c8,0,0xa0);
  local_c8 = 0x7865742e;
  local_c4 = 0x74;
  local_b4 = 0xb4;
  local_b8 = (int)*(undefined8 *)(local_8 + 0x30);
  local_b0 = local_b8 + 0xb4;
  local_a8 = (undefined2)*(uint *)(local_8 + 0x44);
  local_8c = (*(uint *)(local_8 + 0x44) & 0xffff) * 10 + local_b0;
  local_a4 = 0x60500020;
  local_a0 = 0x6164702e;
  local_9c = 0x6174;
  local_90 = 0x18;
  local_88 = local_8c + 0x18;
  local_80 = 6;
  local_64 = local_8c + 0x54;
  local_7c = 0x40300040;
  local_78 = 0x6164782e;
  local_74 = 0x6174;
  local_68 = 0x20;
  local_60 = local_8c + 0x74;
  local_58 = 1;
  iVar1 = local_8c + 0x7e;
  local_54 = 0x40300040;
  builtin_strncpy(local_50,".rdata$Z",8);
  local_3c = iVar1;
  sVar3 = strlen(*(char **)(local_8 + 0x88));
  local_40 = (int)sVar3 + 1;
  local_14 = local_40 + iVar1;
  local_2c = 0x40300040;
  local_1c = 0x8664;
  local_1a = 4;
  local_18 = 0;
  local_c = 0;
  local_a = 0;
  iVar1 = *(int *)(local_8 + 0x48);
  local_10 = *(int *)(local_8 + 0x40) + iVar1 + 0xb;
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  for (local_d0 = 0; local_d0 < *(int *)(local_8 + 0x44); local_d0 = local_d0 + 1) {
    owrite((BuildCtx *)
           CONCAT26(in_stack_fffffffffffffed6,
                    CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
           (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
           in_stack_fffffffffffffec0);
  }
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  scl = 0x50019;
  type = 0x30004200;
  sect = 0x70006000;
  value = 0x5000;
  uVar7 = 0;
  uVar6 = 0;
  uVar8 = 1;
  uVar9 = 0x1504;
  uVar10 = 0x300;
  uVar11 = 0x200;
  uVar12 = 0x3000;
  uVar13 = 0x5000;
  owrite((BuildCtx *)
         CONCAT26(in_stack_fffffffffffffed6,
                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
         in_stack_fffffffffffffec0);
  uVar4 = 0x10;
  iVar2 = iVar1 + 7;
  uVar5 = 3;
  owrite((BuildCtx *)CONCAT26(in_stack_fffffffffffffed6,CONCAT24(3,iVar2)),
         (void *)CONCAT44(0x10,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0);
  sz = *(size_t *)(local_8 + 0x88);
  strlen(*(char **)(local_8 + 0x88));
  owrite((BuildCtx *)CONCAT26(in_stack_fffffffffffffed6,CONCAT24(uVar5,iVar2)),
         (void *)CONCAT44(uVar4,in_stack_fffffffffffffec8),sz);
  strtab = (char *)0x0;
  while( true ) {
    strtabofs = 4;
    emit_peobj_sym((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                   (char *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value,sect,type,scl
                  );
    emit_peobj_sym_sect((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                        (PEsection *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value);
    for (local_d0 = 0; local_d0 < iVar1; local_d0 = local_d0 + 1) {
      emit_peobj_sym((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                     (char *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value,sect,type,
                     scl);
    }
    emit_peobj_sym_sect((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                        (PEsection *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value);
    emit_peobj_sym_sect((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                        (PEsection *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value);
    emit_peobj_sym((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                   (char *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value,sect,type,scl
                  );
    emit_peobj_sym((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                   (char *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value,sect,type,scl
                  );
    for (local_d0 = 0; local_d0 < *(int *)(local_8 + 0x40); local_d0 = local_d0 + 1) {
      emit_peobj_sym((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                     (char *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value,sect,type,
                     scl);
    }
    emit_peobj_sym_sect((BuildCtx *)CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar10))),
                        (PEsection *)CONCAT26(uVar9,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))),value);
    if (strtab != (char *)0x0) break;
    strtab = (char *)malloc(strtabofs);
    *(int *)strtab = (int)strtabofs;
  }
  owrite((BuildCtx *)CONCAT26(in_stack_fffffffffffffed6,CONCAT24(uVar5,iVar2)),
         (void *)CONCAT44(uVar4,in_stack_fffffffffffffec8),sz);
  return;
}

Assistant:

void emit_peobj(BuildCtx *ctx)
{
  PEheader pehdr;
  PEsection pesect[PEOBJ_NSECTIONS];
  uint32_t sofs;
  int i, nrsym;
  union { uint8_t b; uint32_t u; } host_endian;

  sofs = sizeof(PEheader) + PEOBJ_NSECTIONS*sizeof(PEsection);

  /* Fill in PE sections. */
  memset(&pesect, 0, PEOBJ_NSECTIONS*sizeof(PEsection));
  memcpy(pesect[PEOBJ_SECT_TEXT].name, ".text", sizeof(".text")-1);
  pesect[PEOBJ_SECT_TEXT].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].size = (uint32_t)ctx->codesz);
  pesect[PEOBJ_SECT_TEXT].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].nreloc = (uint16_t)ctx->nreloc) * PEOBJ_RELOC_SIZE;
  /* Flags: 60 = read+execute, 50 = align16, 20 = code. */
  pesect[PEOBJ_SECT_TEXT].flags = PEOBJ_TEXT_FLAGS;

#if LJ_TARGET_X64
  memcpy(pesect[PEOBJ_SECT_PDATA].name, ".pdata", sizeof(".pdata")-1);
  pesect[PEOBJ_SECT_PDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].size = 6*4);
  pesect[PEOBJ_SECT_PDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].nreloc = 6) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_PDATA].flags = 0x40300040;

  memcpy(pesect[PEOBJ_SECT_XDATA].name, ".xdata", sizeof(".xdata")-1);
  pesect[PEOBJ_SECT_XDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].size = 8*2+4+6*2);  /* See below. */
  pesect[PEOBJ_SECT_XDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].nreloc = 1) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_XDATA].flags = 0x40300040;
#elif LJ_TARGET_X86
  memcpy(pesect[PEOBJ_SECT_SXDATA].name, ".sxdata", sizeof(".sxdata")-1);
  pesect[PEOBJ_SECT_SXDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_SXDATA].size = 4);
  pesect[PEOBJ_SECT_SXDATA].relocofs = sofs;
  /* Flags: 40 = read, 30 = align4, 02 = lnk_info, 40 = initialized data. */
  pesect[PEOBJ_SECT_SXDATA].flags = 0x40300240;
#endif

  memcpy(pesect[PEOBJ_SECT_RDATA_Z].name, ".rdata$Z", sizeof(".rdata$Z")-1);
  pesect[PEOBJ_SECT_RDATA_Z].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_RDATA_Z].size = (uint32_t)strlen(ctx->dasm_ident)+1);
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_RDATA_Z].flags = 0x40300040;

  /* Fill in PE header. */
  pehdr.arch = PEOBJ_ARCH_TARGET;
  pehdr.nsects = PEOBJ_NSECTIONS;
  pehdr.time = 0;  /* Timestamp is optional. */
  pehdr.symtabofs = sofs;
  pehdr.opthdrsz = 0;
  pehdr.flags = 0;

  /* Compute the size of the symbol table:
  ** @feat.00 + nsections*2
  ** + asm_start + nsym
  ** + nrsym
  */
  nrsym = ctx->nrelocsym;
  pehdr.nsyms = 1+PEOBJ_NSECTIONS*2 + 1+ctx->nsym + nrsym;
#if LJ_TARGET_X64
  pehdr.nsyms += 1;  /* Symbol for lj_err_unwind_win. */
#endif

  /* Write PE object header and all sections. */
  owrite(ctx, &pehdr, sizeof(PEheader));
  owrite(ctx, &pesect, sizeof(PEsection)*PEOBJ_NSECTIONS);

  /* Write .text section. */
  host_endian.u = 1;
  if (host_endian.b != LJ_ENDIAN_SELECT(1, 0)) {
#if LJ_TARGET_PPC
    uint32_t *p = (uint32_t *)ctx->code;
    int n = (int)(ctx->codesz >> 2);
    for (i = 0; i < n; i++, p++)
      *p = lj_bswap(*p);  /* Byteswap .text section. */
#else
    fprintf(stderr, "Error: different byte order for host and target\n");
    exit(1);
#endif
  }
  owrite(ctx, ctx->code, ctx->codesz);
  for (i = 0; i < ctx->nreloc; i++) {
    PEreloc reloc;
    reloc.vaddr = (uint32_t)ctx->reloc[i].ofs + PEOBJ_RELOC_OFS;
    reloc.symidx = 1+2+ctx->reloc[i].sym;  /* Reloc syms are after .text sym. */
    reloc.type = ctx->reloc[i].type ? PEOBJ_RELOC_REL32 : PEOBJ_RELOC_DIR32;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }

#if LJ_TARGET_X64
  { /* Write .pdata section. */
    uint32_t fcofs = (uint32_t)ctx->sym[ctx->nsym-1].ofs;
    uint32_t pdata[3];  /* Start of .text, end of .text and .xdata. */
    PEreloc reloc;
    pdata[0] = 0; pdata[1] = fcofs; pdata[2] = 0;
    owrite(ctx, &pdata, sizeof(pdata));
    pdata[0] = fcofs; pdata[1] = (uint32_t)ctx->codesz; pdata[2] = 20;
    owrite(ctx, &pdata, sizeof(pdata));
    reloc.vaddr = 0; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 4; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 8; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 12; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 16; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 20; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
  { /* Write .xdata section. */
    uint16_t xdata[8+2+6];
    PEreloc reloc;
    xdata[0] = 0x01|0x08|0x10;  /* Ver. 1, uhandler/ehandler, prolog size 0. */
    xdata[1] = 0x0005;  /* Number of unwind codes, no frame pointer. */
    xdata[2] = 0x4200;  /* Stack offset 4*8+8 = aword*5. */
    xdata[3] = 0x3000;  /* Push rbx. */
    xdata[4] = 0x6000;  /* Push rsi. */
    xdata[5] = 0x7000;  /* Push rdi. */
    xdata[6] = 0x5000;  /* Push rbp. */
    xdata[7] = 0;  /* Alignment. */
    xdata[8] = xdata[9] = 0;  /* Relocated address of exception handler. */
    xdata[10] = 0x01;  /* Ver. 1, no handler, prolog size 0. */
    xdata[11] = 0x1504;  /* Number of unwind codes, fp = rbp, fpofs = 16. */
    xdata[12] = 0x0300;  /* set_fpreg. */
    xdata[13] = 0x0200;  /* stack offset 0*8+8 = aword*1. */
    xdata[14] = 0x3000;  /* Push rbx. */
    xdata[15] = 0x5000;  /* Push rbp. */
    owrite(ctx, &xdata, sizeof(xdata));
    reloc.vaddr = 2*8; reloc.symidx = 1+2+nrsym+2+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
#elif LJ_TARGET_X86
  /* Write .sxdata section. */
  for (i = 0; i < nrsym; i++) {
    if (!strcmp(ctx->relocsym[i], "_lj_err_unwind_win")) {
      uint32_t symidx = 1+2+i;
      owrite(ctx, &symidx, 4);
      break;
    }
  }
  if (i == nrsym) {
    fprintf(stderr, "Error: extern lj_err_unwind_win not used\n");
    exit(1);
  }
#endif

  /* Write .rdata$Z section. */
  owrite(ctx, ctx->dasm_ident, strlen(ctx->dasm_ident)+1);

  /* Write symbol table. */
  strtab = NULL;  /* 1st pass: collect string sizes. */
  for (;;) {
    strtabofs = 4;
    /* Mark as SafeSEH compliant. */
    emit_peobj_sym(ctx, "@feat.00", 1,
		   PEOBJ_SECT_ABS, PEOBJ_TYPE_NULL, PEOBJ_SCL_STATIC);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_TEXT);
    for (i = 0; i < nrsym; i++)
      emit_peobj_sym(ctx, ctx->relocsym[i], 0,
		     PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

#if LJ_TARGET_X64
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_PDATA);
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_XDATA);
    emit_peobj_sym(ctx, "lj_err_unwind_win", 0,
		   PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);
#elif LJ_TARGET_X86
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_SXDATA);
#endif

    emit_peobj_sym(ctx, ctx->beginsym, 0,
		   PEOBJ_SECT_TEXT, PEOBJ_TYPE_NULL, PEOBJ_SCL_EXTERN);
    for (i = 0; i < ctx->nsym; i++)
      emit_peobj_sym(ctx, ctx->sym[i].name, (uint32_t)ctx->sym[i].ofs,
		     PEOBJ_SECT_TEXT, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_RDATA_Z);

    if (strtab)
      break;
    /* 2nd pass: alloc strtab, write syms and copy strings. */
    strtab = (char *)malloc(strtabofs);
    *(uint32_t *)strtab = (uint32_t)strtabofs;
  }

  /* Write string table. */
  owrite(ctx, strtab, strtabofs);
}